

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  string *psVar1;
  ostream *poVar2;
  string filename;
  cmGeneratedFileStream fout;
  string local_2a0;
  string local_280;
  undefined1 local_260 [584];
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  std::__cxx11::string::string((string *)&local_280,(string *)psVar1);
  std::__cxx11::string::append((char *)&local_280);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_260,&local_280,false,None);
  if (((byte)(*(_func_int **)(local_260._0_8_ + -0x18))[(long)(local_260 + 0x20)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)local_260,"{\n\t\"name\": \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->ProjectName);
    poVar2 = std::operator<<(poVar2,"\",\n\t\"directory\": \"");
    psVar1 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    poVar2 = std::operator<<(poVar2,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_2a0,this,lg);
    poVar2 = std::operator<<(poVar2,(string *)&local_2a0);
    std::operator<<(poVar2,"} ],\n");
    std::__cxx11::string::~string((string *)&local_2a0);
    WriteTargets(this,lg,(cmGeneratedFileStream *)local_260);
    std::operator<<((ostream *)local_260,"}\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_260);
  std::__cxx11::string::~string((string *)&local_280);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
  const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  /* clang-format off */
  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg->GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  /* clang-format on */
  this->WriteTargets(lg, fout);
  fout << "}\n";
}